

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

vw * parse_args(options_i *options,trace_message_t trace_listener,void *trace_context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  vw *this;
  typed_option<unsigned_long> *ptVar9;
  parser *this_00;
  option_group_definition *poVar10;
  typed_option<int> *op;
  AllReduceSockets *this_01;
  vw_exception *this_02;
  byte bVar11;
  byte bVar12;
  int span_server_port_arg;
  option_group_definition weight_args;
  size_t total_arg;
  size_t unique_id_arg;
  size_t ring_size;
  size_t node_arg;
  option_group_definition update_args;
  option_group_definition vw_args;
  string span_server_arg;
  option_group_definition parallelization_args;
  stringstream __msg;
  undefined1 *local_a30 [2];
  undefined1 local_a20 [16];
  undefined1 *local_a10 [2];
  undefined1 local_a00 [16];
  undefined1 *local_9f0 [2];
  undefined1 local_9e0 [20];
  int local_9cc;
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  undefined1 *local_9a8 [2];
  undefined1 local_998 [16];
  option_group_definition local_988;
  undefined1 *local_950 [2];
  undefined1 local_940 [16];
  undefined1 *local_930 [2];
  undefined1 local_920 [16];
  size_t local_910;
  string local_908;
  string local_8e8;
  undefined1 *local_8c8 [2];
  undefined1 local_8b8 [16];
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  undefined1 local_828 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_790;
  string local_788;
  undefined1 *local_768;
  long local_760;
  undefined1 local_758 [16];
  undefined1 *local_748;
  long local_740;
  undefined1 local_738 [16];
  undefined1 *local_728;
  long local_720;
  undefined1 local_718 [16];
  undefined1 *local_708;
  long local_700;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_660;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_650;
  option_group_definition local_648;
  option_group_definition local_610;
  undefined1 local_5d8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_540;
  undefined1 local_538 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  undefined1 local_498 [48];
  string local_468 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [40];
  pointer psStack_250;
  _Alloc_hider local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  undefined1 local_1d8 [48];
  string local_1a8 [32];
  string local_188 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  string local_50;
  
  this = (vw *)operator_new(0x3658);
  vw::vw(this);
  this->options = options;
  if (trace_listener != (trace_message_t)0x0) {
    *(trace_message_t *)&(this->trace_message).super_ostream.field_0x80 = trace_listener;
    *(void **)&(this->trace_message).super_ostream.field_0x78 = trace_context;
  }
  time(&this->init_time);
  local_708 = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"VW options","");
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_610,local_708,local_708 + local_700);
  local_610.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_610.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_610.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_708 != local_6f8) {
    operator_delete(local_708);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"ring_size","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1d8,&local_298,&local_910);
  ptVar9 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_1d8,0x100);
  local_828._0_8_ = local_828 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"size of example ring","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_610,ptVar9);
  if ((undefined1 *)local_828._0_8_ != local_828 + 0x10) {
    operator_delete((void *)local_828._0_8_);
  }
  local_1d8._0_8_ = &PTR__typed_option_002d9f38;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_610);
  this_00 = (parser *)operator_new(0x398);
  parser::parser(this_00,local_910);
  this->p = this_00;
  local_728 = local_718;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"Update options","");
  local_648.m_name._M_dataplus._M_p = (pointer)&local_648.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_648,local_728,local_728 + local_720);
  local_648.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_728 != local_718) {
    operator_delete(local_728);
  }
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"learning_rate","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1d8,&local_788,&this->eta);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Set learning rate","");
  std::__cxx11::string::_M_assign(local_1a8);
  local_498._0_8_ = local_498 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"l","");
  std::__cxx11::string::_M_assign(local_188);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (&local_648,(typed_option<float> *)local_1d8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"power_t","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_828,&local_2b8,&this->power_t);
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"t power value","");
  std::__cxx11::string::_M_assign((string *)(local_828 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,(typed_option<float> *)local_828);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"decay_learning_rate","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_538,&local_2d8,&this->eta_decay_rate);
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a30,"Set Decay factor for learning_rate between passes","");
  std::__cxx11::string::_M_assign((string *)(local_538 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,(typed_option<float> *)local_538);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"initial_t","");
  VW::config::typed_option<double>::typed_option
            ((typed_option<double> *)local_5d8,&local_2f8,&this->sd->t);
  local_9f0[0] = local_9e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f0,"initial t value","");
  std::__cxx11::string::_M_assign((string *)(local_5d8 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<double>&>
                      (poVar10,(typed_option<double> *)local_5d8);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"feature_mask","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6e8,&local_318,&this->feature_mask);
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,
             "Use existing regressor to determine which parameters may be updated.  If no initial_regressor given, also used for initial weights."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_6e8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar10,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_6e8);
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  local_6e8._0_8_ = &PTR__typed_option_002da010;
  if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650._M_pi);
  }
  if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if (local_9f0[0] != local_9e0) {
    operator_delete(local_9f0[0]);
  }
  local_5d8._0_8_ = &PTR__typed_option_002da578;
  if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_540._M_pi);
  }
  if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  paVar1 = &local_988.m_name.field_2;
  if (local_a30[0] != local_a20) {
    operator_delete(local_a30[0]);
  }
  local_538._0_8_ = &PTR__typed_option_002d9fa0;
  if (local_4a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0._M_pi);
  }
  if (local_4b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_988.m_name._M_dataplus._M_p);
  }
  local_828._0_8_ = &PTR__typed_option_002d9fa0;
  if (local_790._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_790._M_pi);
  }
  if (local_7a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
    operator_delete((void *)local_498._0_8_);
  }
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_);
  }
  local_1d8._0_8_ = &PTR__typed_option_002d9fa0;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_648);
  local_748 = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"Weight options","");
  local_988.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_988,local_748,local_748 + local_740);
  local_988.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_988.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_988.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_748 != local_738) {
    operator_delete(local_748);
  }
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"initial_regressor","");
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1d8,&local_848,&this->initial_regressors);
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"Initial regressor(s)","");
  std::__cxx11::string::_M_assign(local_1a8);
  local_9f0[0] = local_9e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f0,"i","");
  std::__cxx11::string::_M_assign(local_188);
  poVar10 = VW::config::option_group_definition::
            add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                      (&local_988,
                       (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_1d8);
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"initial_weight","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_828,&local_868,&this->initial_weight);
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"Set all weights to an initial value of arg.","");
  std::__cxx11::string::_M_assign((string *)(local_828 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,(typed_option<float> *)local_828);
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"random_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_538,&local_888,&this->random_weights);
  local_9a8[0] = local_998;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9a8,"make initial weights random","");
  std::__cxx11::string::_M_assign((string *)(local_538 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_538);
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"normal_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d8,&local_8a8,&this->normal_weights);
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9c8,"make initial weights normal","");
  std::__cxx11::string::_M_assign((string *)(local_5d8 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_5d8);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,"truncated_normal_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6e8,&local_338,&this->tnormal_weights);
  local_930[0] = local_920;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_930,"make initial weights truncated normal","");
  std::__cxx11::string::_M_assign((string *)(local_6e8 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_6e8);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"sparse_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_278,&local_358,&(this->weights).sparse);
  local_950[0] = local_940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_950,"Use a sparse datastructure for weights","");
  std::__cxx11::string::_M_assign((string *)&local_248);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (poVar10,(typed_option<bool> *)local_278);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_378,"input_feature_regularizer","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_498,&local_378,&this->per_feature_regularizer_input);
  local_8c8[0] = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c8,"Per feature regularization input file","");
  std::__cxx11::string::_M_assign(local_468);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar10,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_498);
  if (local_8c8[0] != local_8b8) {
    operator_delete(local_8c8[0]);
  }
  local_498._0_8_ = &PTR__typed_option_002da010;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if (local_950[0] != local_940) {
    operator_delete(local_950[0]);
  }
  local_278._0_8_ = &PTR__typed_option_002d9fd8;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  if (local_930[0] != local_920) {
    operator_delete(local_930[0]);
  }
  local_6e8._0_8_ = &PTR__typed_option_002d9fd8;
  if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650._M_pi);
  }
  if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0]);
  }
  local_5d8._0_8_ = &PTR__typed_option_002d9fd8;
  if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_540._M_pi);
  }
  if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p);
  }
  if (local_9a8[0] != local_998) {
    operator_delete(local_9a8[0]);
  }
  local_538._0_8_ = &PTR__typed_option_002d9fd8;
  if (local_4a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0._M_pi);
  }
  if (local_4b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  local_828._0_8_ = &PTR__typed_option_002d9fa0;
  if (local_790._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_790._M_pi);
  }
  if (local_7a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  if (local_9f0[0] != local_9e0) {
    operator_delete(local_9f0[0]);
  }
  if (local_a30[0] != local_a20) {
    operator_delete(local_a30[0]);
  }
  local_1d8._0_8_ = &PTR__typed_option_002da540;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_988);
  local_498._0_8_ = local_498 + 0x10;
  local_498._8_8_ = (pointer)0x0;
  local_498[0x10] = '\0';
  local_768 = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"Parallelization options","")
  ;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_278,local_768,local_768 + local_760);
  local_278._32_8_ = 0;
  psStack_250 = (pointer)0x0;
  local_248._M_p = (pointer)0x0;
  if (local_768 != local_758) {
    operator_delete(local_768);
  }
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"span_server","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1d8,&local_398,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a30,"Location of server for setting up spanning tree","");
  std::__cxx11::string::_M_assign(local_1a8);
  poVar10 = VW::config::option_group_definition::
            add<VW::config::typed_option<std::__cxx11::string>&>
                      ((option_group_definition *)local_278,
                       (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1d8);
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"unique_id","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_828,&local_8e8,(unsigned_long *)local_930);
  ptVar9 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_828,0);
  local_9f0[0] = local_9e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9f0,"unique id used for cluster parallel jobs","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                      (poVar10,ptVar9);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"total","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_538,&local_3b8,(unsigned_long *)local_950);
  ptVar9 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_538,1);
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"total number of nodes used in cluster parallel job","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                      (poVar10,ptVar9);
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"node","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_5d8,&local_908,(unsigned_long *)local_8c8);
  ptVar9 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_5d8,0);
  local_9a8[0] = local_998;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9a8,"node number in cluster parallel job","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                      (poVar10,ptVar9);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"span_server_port","");
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_6e8,&local_3d8,&local_9cc);
  op = VW::config::typed_option<int>::default_value((typed_option<int> *)local_6e8,0x67af);
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9c8,"Port of the server for setting up spanning tree","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar10,op);
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0]);
  }
  local_6e8._0_8_ = &PTR__typed_option_002da5b0;
  if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650._M_pi);
  }
  if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if (local_9a8[0] != local_998) {
    operator_delete(local_9a8[0]);
  }
  local_5d8._0_8_ = &PTR__typed_option_002d9f38;
  if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_540._M_pi);
  }
  if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  local_538._0_8_ = &PTR__typed_option_002d9f38;
  if (local_4a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0._M_pi);
  }
  if (local_4b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
  if (local_9f0[0] != local_9e0) {
    operator_delete(local_9f0[0]);
  }
  local_828._0_8_ = &PTR__typed_option_002d9f38;
  if (local_790._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_790._M_pi);
  }
  if (local_7a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p);
  }
  if (local_a30[0] != local_a20) {
    operator_delete(local_a30[0]);
  }
  local_1d8._0_8_ = &PTR__typed_option_002da010;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,local_278);
  local_1d8._0_8_ = local_1d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"total","");
  iVar7 = (*options->_vptr_options_i[1])(options,local_1d8);
  if ((byte)iVar7 == 0) {
    local_828._0_8_ = local_828 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"node","");
    iVar8 = (*options->_vptr_options_i[1])(options,local_828);
    if ((char)iVar8 != '\0') goto LAB_00153bf6;
    local_538._0_8_ = local_538 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"unique_id","");
    iVar8 = (*options->_vptr_options_i[1])(options,local_538);
    bVar5 = true;
    bVar3 = true;
    if ((char)iVar8 == '\0') {
      bVar4 = false;
      bVar11 = 1;
      cVar6 = '\0';
      bVar3 = false;
      bVar12 = 0;
      goto LAB_00153cb8;
    }
  }
  else {
LAB_00153bf6:
    bVar3 = false;
  }
  bVar5 = bVar3;
  bVar11 = (byte)iVar7 ^ 1;
  local_5d8._0_8_ = local_5d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"total","");
  iVar7 = (*options->_vptr_options_i[1])(options,local_5d8);
  cVar6 = (char)iVar7;
  if (cVar6 == '\0') {
LAB_00153cad:
    bVar3 = false;
    bVar12 = 0;
  }
  else {
    local_6e8._0_8_ = local_6e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"node","");
    iVar7 = (*options->_vptr_options_i[1])(options,local_6e8);
    if ((char)iVar7 == '\0') goto LAB_00153cad;
    local_a30[0] = local_a20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"unique_id","");
    iVar7 = (*options->_vptr_options_i[1])(options,local_a30);
    bVar12 = (byte)iVar7;
    bVar3 = true;
  }
  bVar12 = bVar12 ^ 1;
  bVar4 = true;
LAB_00153cb8:
  if ((bVar3) && (local_a30[0] != local_a20)) {
    operator_delete(local_a30[0]);
  }
  if ((cVar6 != '\0') && ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10)) {
    operator_delete((void *)local_6e8._0_8_);
  }
  pp_Var2 = (_func_int **)(local_1d8 + 0x10);
  if ((bVar4) && ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10)) {
    operator_delete((void *)local_5d8._0_8_);
  }
  if ((bVar5) && ((undefined1 *)local_538._0_8_ != local_538 + 0x10)) {
    operator_delete((void *)local_538._0_8_);
  }
  if ((bVar11 != 0) && ((undefined1 *)local_828._0_8_ != local_828 + 0x10)) {
    operator_delete((void *)local_828._0_8_);
  }
  if ((_func_int **)local_1d8._0_8_ != pp_Var2) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if (bVar12 == 0) {
    local_1d8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"span_server","");
    iVar7 = (*options->_vptr_options_i[1])(options,local_1d8);
    if ((_func_int **)local_1d8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((char)iVar7 != '\0') {
      this->all_reduce_type = Socket;
      this_01 = (AllReduceSockets *)operator_new(0x78);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3f8,local_498._0_8_,(pointer)(local_498._8_8_ + local_498._0_8_));
      AllReduceSockets::AllReduceSockets
                (this_01,&local_3f8,local_9cc,(size_t)local_930[0],(size_t)local_950[0],
                 (size_t)local_8c8[0]);
      this->all_reduce = (AllReduce *)this_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p);
      }
    }
    parse_diagnostics(options,this);
    this->initial_t = (float)this->sd->t;
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
               *)(local_278 + 0x20));
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_);
    }
    if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
      operator_delete((void *)local_498._0_8_);
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_988.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
      operator_delete(local_988.m_name._M_dataplus._M_p);
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_648.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648.m_name._M_dataplus._M_p != &local_648.m_name.field_2) {
      operator_delete(local_648.m_name._M_dataplus._M_p);
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_610.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
      operator_delete(local_610.m_name._M_dataplus._M_p);
    }
    return this;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1d8 + 0x10),
             "you must specificy unique_id, total, and node if you specify any",0x40);
  this_02 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x54e,&local_50);
  __cxa_throw(this_02,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

vw& parse_args(options_i& options, trace_message_t trace_listener, void* trace_context)
{
  vw& all = *(new vw());
  all.options = &options;

  if (trace_listener)
  {
    all.trace_message.trace_listener = trace_listener;
    all.trace_message.trace_context = trace_context;
  }

  try
  {
    time(&all.init_time);

    size_t ring_size;
    option_group_definition vw_args("VW options");
    vw_args.add(make_option("ring_size", ring_size).default_value(256).help("size of example ring"));
    options.add_and_parse(vw_args);

    all.p = new parser{ring_size};

    option_group_definition update_args("Update options");
    update_args.add(make_option("learning_rate", all.eta).help("Set learning rate").short_name("l"))
        .add(make_option("power_t", all.power_t).help("t power value"))
        .add(make_option("decay_learning_rate", all.eta_decay_rate)
                 .help("Set Decay factor for learning_rate between passes"))
        .add(make_option("initial_t", all.sd->t).help("initial t value"))
        .add(make_option("feature_mask", all.feature_mask)
                 .help("Use existing regressor to determine which parameters may be updated.  If no initial_regressor "
                       "given, also used for initial weights."));
    options.add_and_parse(update_args);

    option_group_definition weight_args("Weight options");
    weight_args
        .add(make_option("initial_regressor", all.initial_regressors).help("Initial regressor(s)").short_name("i"))
        .add(make_option("initial_weight", all.initial_weight).help("Set all weights to an initial value of arg."))
        .add(make_option("random_weights", all.random_weights).help("make initial weights random"))
        .add(make_option("normal_weights", all.normal_weights).help("make initial weights normal"))
        .add(make_option("truncated_normal_weights", all.tnormal_weights).help("make initial weights truncated normal"))
        .add(make_option("sparse_weights", all.weights.sparse).help("Use a sparse datastructure for weights"))
        .add(make_option("input_feature_regularizer", all.per_feature_regularizer_input)
                 .help("Per feature regularization input file"));
    options.add_and_parse(weight_args);

    std::string span_server_arg;
    int span_server_port_arg;
    // bool threads_arg;
    size_t unique_id_arg;
    size_t total_arg;
    size_t node_arg;
    option_group_definition parallelization_args("Parallelization options");
    parallelization_args
        .add(make_option("span_server", span_server_arg).help("Location of server for setting up spanning tree"))
        //(make_option("threads", threads_arg).help("Enable multi-threading")) Unused option?
        .add(make_option("unique_id", unique_id_arg).default_value(0).help("unique id used for cluster parallel jobs"))
        .add(
            make_option("total", total_arg).default_value(1).help("total number of nodes used in cluster parallel job"))
        .add(make_option("node", node_arg).default_value(0).help("node number in cluster parallel job"))
        .add(make_option("span_server_port", span_server_port_arg).default_value(26543)
          .help("Port of the server for setting up spanning tree"));
    options.add_and_parse(parallelization_args);

    // total, unique_id and node must be specified together.
    if ((options.was_supplied("total") || options.was_supplied("node") || options.was_supplied("unique_id")) &&
        !(options.was_supplied("total") && options.was_supplied("node") && options.was_supplied("unique_id")))
    {
      THROW("you must specificy unique_id, total, and node if you specify any");
    }

    if (options.was_supplied("span_server"))
    {
      all.all_reduce_type = AllReduceType::Socket;
      all.all_reduce = new AllReduceSockets(span_server_arg, span_server_port_arg, unique_id_arg, total_arg, node_arg);
    }

    parse_diagnostics(options, all);

    all.initial_t = (float)all.sd->t;
    return all;
  }
  catch (...)
  {
    VW::finish(all);
    throw;
  }
}